

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
BaseDictionary<Js::ByteBuffer*,Js::IndexEntry,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::FindEntryWithKey<Js::ByteBuffer*>
          (BaseDictionary<Js::ByteBuffer*,Js::IndexEntry,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,ByteBuffer **key)

{
  long lVar1;
  ByteBuffer *pBVar2;
  uint *puVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint depth;
  uint uVar7;
  uint uVar8;
  hash_t hVar9;
  DictionaryStats *this_00;
  
  lVar1 = *(long *)this;
  depth = 0;
  if (lVar1 != 0) {
    uVar5 = (ulong)(*key)->byteCount;
    if (uVar5 == 0) {
      hVar9 = 0x11c9dc5;
    }
    else {
      uVar7 = 0x811c9dc5;
      uVar6 = 0;
      do {
        uVar8 = (int)*(char *)((long)((*key)->field_1).pv + uVar6) ^ uVar7;
        uVar7 = uVar8 * 0x1000193;
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
      hVar9 = uVar8 * 0x2000326 >> 1;
    }
    hVar9 = PrimePolicy::ModPrime(hVar9,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar7 = *(uint *)(lVar1 + (ulong)hVar9 * 4);
    depth = 0;
    if (-1 < (int)uVar7) {
      lVar1 = *(long *)(this + 8);
      pBVar2 = *key;
      uVar8 = pBVar2->byteCount;
      depth = 0;
      do {
        puVar3 = *(uint **)(lVar1 + 0x18 + (ulong)uVar7 * 0x20);
        if (*puVar3 == uVar8) {
          iVar4 = bcmp(*(void **)(puVar3 + 2),(pBVar2->field_1).pv,(ulong)uVar8);
          if (iVar4 == 0) {
            this_00 = *(DictionaryStats **)(this + 0x30);
            goto LAB_00873c7b;
          }
        }
        depth = depth + 1;
        uVar7 = *(uint *)((ulong)uVar7 * 0x20 + lVar1 + 0x10);
      } while (-1 < (int)uVar7);
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  uVar7 = 0xffffffff;
LAB_00873c7b:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,depth);
  }
  return uVar7;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }